

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O0

IntrinsicResult intrinsic_chdir(Context *context,IntrinsicResult *partialResult)

{
  bool bVar1;
  int iVar2;
  char *__path;
  Value local_90;
  byte local_79;
  undefined1 local_78 [7];
  bool ok;
  String pathStr;
  Value local_60 [2];
  String local_40;
  undefined1 local_30 [8];
  Value path;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  MiniScript::String::String(&local_40,"path");
  MiniScript::Context::GetVar((Context *)local_30,(String *)partialResult,(LocalOnlyMode)&local_40);
  MiniScript::String::~String(&local_40);
  bVar1 = MiniScript::Value::IsNull((Value *)local_30);
  if (bVar1) {
    MiniScript::Value::Value(local_60,(Value *)MiniScript::Value::zero);
    MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,local_60,true);
    MiniScript::Value::~Value(local_60);
    pathStr._12_4_ = 1;
  }
  else {
    MiniScript::Value::ToString((Value *)local_78,(Machine *)local_30);
    local_79 = 0;
    bVar1 = MiniScript::String::empty((String *)local_78);
    if (!bVar1) {
      __path = MiniScript::String::c_str((String *)local_78);
      iVar2 = chdir(__path);
      if (iVar2 == 0) {
        local_79 = 1;
      }
    }
    MiniScript::Value::Truth(&local_90,(bool)(local_79 & 1));
    MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_90,true);
    MiniScript::Value::~Value(&local_90);
    pathStr._12_4_ = 1;
    MiniScript::String::~String((String *)local_78);
  }
  MiniScript::Value::~Value((Value *)local_30);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_chdir(Context *context, IntrinsicResult partialResult) {
	Value path = context->GetVar("path");
	if (path.IsNull()) return IntrinsicResult(Value::zero);
	String pathStr = path.ToString();
	bool ok = false;
	if (!pathStr.empty()) {
		if (chdir(pathStr.c_str()) == 0) ok = true;
	}
	return IntrinsicResult(Value::Truth(ok));
}